

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O3

REF_STATUS
ref_interp_enclosing_tet_in_list
          (REF_INTERP ref_interp,REF_LIST ref_list,REF_DBL *xyz,REF_INT *cell,REF_DBL *bary)

{
  REF_INT cell_00;
  uint uVar1;
  undefined8 uVar2;
  REF_DBL *in_R9;
  char *pcVar3;
  long lVar4;
  REF_STATUS ref_private_macro_code_rxs;
  double dVar5;
  double dVar6;
  REF_DBL current_bary [4];
  REF_INT nodes [27];
  int local_f8;
  uint local_f4;
  double local_f0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  REF_INT local_a8 [30];
  
  if (0 < *(int *)xyz) {
    local_f0 = -999.0;
    local_f8 = -1;
    lVar4 = 0;
    do {
      cell_00 = *(REF_INT *)((long)xyz[1] + lVar4 * 4);
      uVar1 = ref_cell_nodes((REF_CELL)ref_list,cell_00,local_a8);
      if (uVar1 != 0) {
        pcVar3 = "cell";
        uVar2 = 0x1a6;
        goto LAB_001720e8;
      }
      uVar1 = ref_node_bary4((REF_NODE)ref_interp,local_a8,(REF_DBL *)cell,&local_c8);
      if ((uVar1 & 0xfffffffb) != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x1a8,"ref_interp_enclosing_tet_in_list",(ulong)uVar1,"bary");
        local_f4 = uVar1;
      }
      if (uVar1 != 4) {
        if (uVar1 != 0) {
          return local_f4;
        }
        dVar5 = local_c8;
        if (local_c0 <= local_c8) {
          dVar5 = local_c0;
        }
        dVar6 = local_b8;
        if (local_b0 <= local_b8) {
          dVar6 = local_b0;
        }
        if (dVar6 <= dVar5) {
          dVar5 = dVar6;
        }
        if ((local_f8 == -1) || (local_f0 < dVar5)) {
          local_f8 = cell_00;
          local_f0 = dVar5;
        }
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < *(int *)xyz);
    if (local_f8 != -1) {
      *(int *)bary = local_f8;
      uVar1 = ref_cell_nodes((REF_CELL)ref_list,local_f8,local_a8);
      if (uVar1 == 0) {
        uVar1 = ref_node_bary4((REF_NODE)ref_interp,local_a8,(REF_DBL *)cell,in_R9);
        if (uVar1 == 0) {
          return 0;
        }
        pcVar3 = "bary";
        uVar2 = 0x1b8;
      }
      else {
        pcVar3 = "cell";
        uVar2 = 0x1b7;
      }
LAB_001720e8:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             uVar2,"ref_interp_enclosing_tet_in_list",(ulong)uVar1,pcVar3);
      return uVar1;
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x1b4,
         "ref_interp_enclosing_tet_in_list","failed to find cell");
  return 1;
}

Assistant:

REF_FCN static REF_STATUS ref_interp_enclosing_tet_in_list(
    REF_INTERP ref_interp, REF_LIST ref_list, REF_DBL *xyz, REF_INT *cell,
    REF_DBL *bary) {
  REF_CELL ref_cell = ref_interp_from_tet(ref_interp);
  REF_NODE ref_node = ref_grid_node(ref_interp_from_grid(ref_interp));
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, candidate, best_candidate;
  REF_DBL current_bary[4];
  REF_DBL best_bary, min_bary;
  REF_STATUS status;

  best_candidate = REF_EMPTY;
  best_bary = -999.0;
  each_ref_list_item(ref_list, item) {
    candidate = ref_list_value(ref_list, item);
    RSS(ref_cell_nodes(ref_cell, candidate, nodes), "cell");
    status = ref_node_bary4(ref_node, nodes, xyz, current_bary);
    RXS(status, REF_DIV_ZERO, "bary");
    if (REF_SUCCESS == status) { /* exclude REF_DIV_ZERO */

      min_bary = MIN(MIN(current_bary[0], current_bary[1]),
                     MIN(current_bary[2], current_bary[3]));
      if (REF_EMPTY == best_candidate || min_bary > best_bary) {
        best_candidate = candidate;
        best_bary = min_bary;
      }
    }
  }

  RUS(REF_EMPTY, best_candidate, "failed to find cell");

  *cell = best_candidate;
  RSS(ref_cell_nodes(ref_cell, best_candidate, nodes), "cell");
  RSS(ref_node_bary4(ref_node, nodes, xyz, bary), "bary");

  return REF_SUCCESS;
}